

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_copy_new_frame_image(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  AV1_PRIMARY *img;
  int iVar1;
  AV1_COMP *cpi;
  YV12_BUFFER_CONFIG *in_RSI;
  YV12_BUFFER_CONFIG sd;
  YV12_BUFFER_CONFIG new_frame;
  aom_image_t *new_img;
  undefined4 in_stack_fffffffffffffe38;
  uint uVar2;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 in_stack_fffffffffffffe40;
  aom_codec_err_t local_4;
  
  uVar2 = (in_RSI->field_0).field_0.y_width;
  if (uVar2 < 0x29) {
    cpi = (AV1_COMP *)((long)(int)uVar2 + (long)in_RSI->field_2);
    (in_RSI->field_0).field_0.y_width = uVar2 + 8;
  }
  else {
    cpi = *(AV1_COMP **)(in_RSI->field_1).heights;
    in_RSI->field_1 = (anon_union_8_2_70c94c84_for_yv12_buffer_config_2)&cpi->field_0x8;
  }
  img = cpi->ppi;
  if (img == (AV1_PRIMARY *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar1 = av1_get_last_show_frame(cpi,(YV12_BUFFER_CONFIG *)0x4f8a1f);
    if (iVar1 == 0) {
      image2yuvconfig((aom_image_t *)img,(YV12_BUFFER_CONFIG *)&stack0xfffffffffffffe40);
      local_4 = av1_copy_new_frame_enc
                          ((AV1_COMMON *)in_stack_fffffffffffffe40,
                           (YV12_BUFFER_CONFIG *)CONCAT44(uVar2,in_stack_fffffffffffffe38),in_RSI);
    }
    else {
      local_4 = AOM_CODEC_ERROR;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_copy_new_frame_image(aom_codec_alg_priv_t *ctx,
                                                 va_list args) {
  aom_image_t *img = va_arg(args, aom_image_t *);
  if (img) {
    YV12_BUFFER_CONFIG new_frame;
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;

    if (av1_get_frame_to_show(frame_worker_data->pbi, &new_frame) == 0) {
      YV12_BUFFER_CONFIG sd;
      image2yuvconfig(img, &sd);
      return av1_copy_new_frame_dec(&frame_worker_data->pbi->common, &new_frame,
                                    &sd);
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}